

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeFabricEdgeGetPropertiesExp
          (ze_fabric_edge_handle_t hEdge,ze_fabric_edge_exp_properties_t *pEdgeProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010e728 != (code *)0x0) {
    zVar1 = (*DAT_0010e728)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetPropertiesExp(
        ze_fabric_edge_handle_t hEdge,                  ///< [in] handle of the fabric edge
        ze_fabric_edge_exp_properties_t* pEdgeProperties///< [in,out] query result for fabric edge properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetPropertiesExp = context.zeDdiTable.FabricEdgeExp.pfnGetPropertiesExp;
        if( nullptr != pfnGetPropertiesExp )
        {
            result = pfnGetPropertiesExp( hEdge, pEdgeProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }